

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

LZ4_stream_t * LZ4_initStream(void *buffer,size_t size)

{
  size_t sVar1;
  size_t size_local;
  void *buffer_local;
  
  if (buffer == (void *)0x0) {
    buffer_local = (void *)0x0;
  }
  else if (size < 0x4020) {
    buffer_local = (void *)0x0;
  }
  else {
    sVar1 = LZ4_stream_t_alignment();
    if (((ulong)buffer & sVar1 - 1) == 0) {
      memset(buffer,0,0x4020);
      buffer_local = buffer;
    }
    else {
      buffer_local = (void *)0x0;
    }
  }
  return (LZ4_stream_t *)buffer_local;
}

Assistant:

LZ4_stream_t* LZ4_initStream (void* buffer, size_t size)
{
    DEBUGLOG(5, "LZ4_initStream");
    if (buffer == NULL) { return NULL; }
    if (size < sizeof(LZ4_stream_t)) { return NULL; }
#ifndef _MSC_VER  /* for some reason, Visual fails the aligment test on 32-bit x86 :
                     it reports an aligment of 8-bytes,
                     while actually aligning LZ4_stream_t on 4 bytes. */
    if (((size_t)buffer) & (LZ4_stream_t_alignment() - 1)) { return NULL; } /* alignment check */
#endif
    MEM_INIT(buffer, 0, sizeof(LZ4_stream_t));
    return (LZ4_stream_t*)buffer;
}